

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk-abi-vla-internal.c
# Opt level: O0

void vla_free_from_original_stack(__cilkrts_stack_frame *sf,size_t full_size)

{
  size_t in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    __cilkrts_adjust_stack
              (*(full_frame **)(*(long *)(*(long *)(in_RDI + 0x10) + 0x38) + 0x30),in_RSI);
    return;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk-abi-vla-internal.c"
                ,0x53,"sf->worker");
}

Assistant:

void vla_free_from_original_stack(__cilkrts_stack_frame *sf,
                                  size_t full_size)
{
    // The __cilkrts_stack_frame must be initialized
    CILK_ASSERT(sf->worker);

#if 1
    // Add full_size to ff->sync_sp so that when we return, the VLA will no
    // longer be allocated on the stack
    __cilkrts_adjust_stack(sf->worker->l->frame_ff, full_size);
#else
    // Inline __cilkrts_adjust_stack for Kevin
    full_frame *ff = sf->worker->l->frame_ff;
    ff->sync_sp = ff->sync_sp + full_size;
#endif
}